

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

char * tk_to_string(Tk *tk)

{
  if (0xff < (long)*tk) {
    tk = (Tk *)TK_NAMES[*tk];
  }
  return (char *)tk;
}

Assistant:

char * tk_to_string(Tk *tk) {
	if (*tk < 256) {
		// ASCII code
		return (char *) tk;
	} else {
		// Multi-character token
		return TK_NAMES[*tk];
	}
}